

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_CCtx_setParameter(ZSTD_CCtx *cctx,ZSTD_cParameter param,int value)

{
  size_t sVar1;
  
  if (cctx->streamStage != zcss_init) {
    if ((5 < param - ZSTD_c_hashLog) && (param != ZSTD_c_compressionLevel)) {
      return 0xffffffffffffffc4;
    }
    cctx->cParamsChanged = 1;
  }
  if ((int)param < 400) {
    if ((7 < param - ZSTD_c_compressionLevel) &&
       (((0x2a < param - ZSTD_c_enableLongDistanceMatching ||
         ((0x7000000001fU >> ((ulong)(param - ZSTD_c_enableLongDistanceMatching) & 0x3f) & 1) == 0))
        && (param != ZSTD_c_experimentalParam2)))) {
      return 0xffffffffffffffd8;
    }
  }
  else if ((int)param < 1000) {
    if (1 < param - ZSTD_c_jobSize) {
      if (param == ZSTD_c_nbWorkers) {
        if ((value != 0) && (cctx->staticSize != 0)) {
          return 0xffffffffffffffd8;
        }
      }
      else if (param != ZSTD_c_experimentalParam1) {
        return 0xffffffffffffffd8;
      }
    }
  }
  else if (0xc < param - ZSTD_c_experimentalParam3) {
    return 0xffffffffffffffd8;
  }
  sVar1 = ZSTD_CCtxParams_setParameter(&cctx->requestedParams,param,value);
  return sVar1;
}

Assistant:

size_t ZSTD_CCtx_setParameter(ZSTD_CCtx* cctx, ZSTD_cParameter param, int value)
{
    DEBUGLOG(4, "ZSTD_CCtx_setParameter (%i, %i)", (int)param, value);
    if (cctx->streamStage != zcss_init) {
        if (ZSTD_isUpdateAuthorized(param)) {
            cctx->cParamsChanged = 1;
        } else {
            RETURN_ERROR(stage_wrong, "can only set params in ctx init stage");
    }   }

    switch(param)
    {
    case ZSTD_c_nbWorkers:
        RETURN_ERROR_IF((value!=0) && cctx->staticSize, parameter_unsupported,
                        "MT not compatible with static alloc");
        break;

    case ZSTD_c_compressionLevel:
    case ZSTD_c_windowLog:
    case ZSTD_c_hashLog:
    case ZSTD_c_chainLog:
    case ZSTD_c_searchLog:
    case ZSTD_c_minMatch:
    case ZSTD_c_targetLength:
    case ZSTD_c_strategy:
    case ZSTD_c_ldmHashRateLog:
    case ZSTD_c_format:
    case ZSTD_c_contentSizeFlag:
    case ZSTD_c_checksumFlag:
    case ZSTD_c_dictIDFlag:
    case ZSTD_c_forceMaxWindow:
    case ZSTD_c_forceAttachDict:
    case ZSTD_c_literalCompressionMode:
    case ZSTD_c_jobSize:
    case ZSTD_c_overlapLog:
    case ZSTD_c_rsyncable:
    case ZSTD_c_enableDedicatedDictSearch:
    case ZSTD_c_enableLongDistanceMatching:
    case ZSTD_c_ldmHashLog:
    case ZSTD_c_ldmMinMatch:
    case ZSTD_c_ldmBucketSizeLog:
    case ZSTD_c_targetCBlockSize:
    case ZSTD_c_srcSizeHint:
    case ZSTD_c_stableInBuffer:
    case ZSTD_c_stableOutBuffer:
    case ZSTD_c_blockDelimiters:
    case ZSTD_c_validateSequences:
    case ZSTD_c_splitBlocks:
    case ZSTD_c_useRowMatchFinder:
    case ZSTD_c_deterministicRefPrefix:
        break;

    default: RETURN_ERROR(parameter_unsupported, "unknown parameter");
    }
    return ZSTD_CCtxParams_setParameter(&cctx->requestedParams, param, value);
}